

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grovepi.c
# Opt level: O3

mraa_pwm_context mraa_grovepi_pwm_init_internal_replace(void *func_table,int pin)

{
  mraa_pwm_context p_Var1;
  
  p_Var1 = (mraa_pwm_context)calloc(1,0x20);
  if (p_Var1 != (mraa_pwm_context)0x0) {
    p_Var1->pin = pin;
    p_Var1->chipid = 0x200;
    p_Var1->period = 0x1f4000;
    p_Var1->advance_func = (mraa_adv_func_t *)func_table;
  }
  return p_Var1;
}

Assistant:

static mraa_pwm_context
mraa_grovepi_pwm_init_internal_replace(void* func_table, int pin)
{
    mraa_pwm_context dev = (mraa_pwm_context) calloc(1, sizeof(struct _pwm));
    if (dev == NULL) {
        return NULL;
    }
    dev->pin = pin;
    dev->chipid = 512;
    dev->period = 2048000; // Locked, in ns
    dev->advance_func = (mraa_adv_func_t*) func_table;

    return dev;
}